

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O2

int CfdGetTransactionFromBlock(void *handle,void *block_handle,char *txid,char **tx_hex)

{
  Block *this;
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_b1;
  string local_b0;
  Transaction tx;
  string local_50;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&tx,"BlockOpe",(allocator *)&local_b0);
  cfd::capi::CheckBuffer(block_handle,(string *)&tx);
  std::__cxx11::string::~string((string *)&tx);
  if (tx_hex == (char **)0x0) {
    tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x523c4f;
    tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x103;
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_766c11;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx_hex is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx_hex is null.",(allocator *)&local_b0);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x523c4f;
    tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x109;
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_766c11;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. txid is null or empty.",(allocator *)&local_b0);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(Block **)((long)block_handle + 0x18);
  if (this == (Block *)0x0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Invalid handle state. block is null",(allocator *)&local_b0);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(int *)((long)block_handle + 0x10) < 3) {
    std::__cxx11::string::string((string *)&local_50,txid,&local_b1);
    cfd::core::Txid::Txid((Txid *)&local_b0,&local_50);
    cfd::core::Block::GetTransaction(&tx,this,(Txid *)&local_b0);
    cfd::core::Txid::~Txid((Txid *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_b0,&tx.super_AbstractTransaction);
    pcVar2 = cfd::capi::CreateString(&local_b0);
    *tx_hex = pcVar2;
    std::__cxx11::string::~string((string *)&local_b0);
    cfd::core::Transaction::~Transaction(&tx);
    return 0;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&tx,"Elements is not supported.",(allocator *)&local_b0);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTransactionFromBlock(
    void* handle, void* block_handle, const char* txid, char** tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);
    if (tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      auto tx = block_data->block->GetTransaction(Txid(std::string(txid)));
      *tx_hex = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}